

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O3

string * fs_win32_to_narrow_abi_cxx11_(string *__return_storage_ptr__,wstring_view w)

{
  string_view fname;
  error_code local_18;
  
  local_18._M_cat = (error_category *)std::_V2::generic_category();
  local_18._M_value = 0x26;
  fname._M_str = "fs_win32_to_narrow";
  fname._M_len = 0x12;
  fs_print_error((string_view)(ZEXT816(0x1120b9) << 0x40),fname,&local_18);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fs_win32_to_narrow(FFS_MAYBE_UNUSED std::wstring_view w)
{
  std::error_code ec;

#if defined(_WIN32)
  if (int L = WideCharToMultiByte(CP_UTF8, 0, w.data(), -1, nullptr, 0, nullptr, nullptr); L > 0)  FFS_LIKELY
  {
    std::string buf(L, '\0');
    if(WideCharToMultiByte(CP_UTF8, 0, w.data(), -1, buf.data(), L, nullptr, nullptr) > 0)  FFS_LIKELY
    {
      buf.resize(L-1);  // discard null terminator
      return buf;
    }
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error("", __func__, ec);
  return {};
}